

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScatterLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint32 uVar3;
  pointer pcVar4;
  string *psVar5;
  bool bVar6;
  LogMessage *pLVar7;
  Type *pTVar8;
  long *plVar9;
  size_type *psVar10;
  Result *_result;
  _Alloc_hider _Var11;
  string err;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  undefined1 local_a0 [56];
  LogMessage local_68;
  
  validateInputCount(__return_storage_ptr__,layer,3,3);
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation != true) goto LAB_00319b99;
  paVar1 = &local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  iVar2 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (iVar2 < 1) {
LAB_003198ce:
    bVar6 = true;
    if ((0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) &&
       (iVar2 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_, 0 < iVar2)) {
      if (iVar2 != 1) {
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_120,"Scatter layer must have 1 output tensor fields filled","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_120);
        local_a0._16_8_ = local_120.field_2._M_allocated_capacity;
        _Var11._M_p = local_120._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) goto LAB_00319a92;
        goto LAB_00319b7b;
      }
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
      uVar3 = pTVar8->rank_;
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
      if (uVar3 != pTVar8->rank_) {
        psVar5 = (layer->name_).ptr_;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        pcVar4 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,pcVar4,pcVar4 + psVar5->_M_string_length);
        std::operator+(&local_e0,"Output rank of Scatter layer \'",&local_100);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
        psVar10 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_120.field_2._M_allocated_capacity = *psVar10;
          local_120.field_2._8_8_ = plVar9[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar10;
          local_120._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_120._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_00319b45;
        goto LAB_00319b52;
      }
    }
  }
  else {
    if (iVar2 == 3) {
      if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           (&local_68,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      }
      iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                      0x24);
      if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_120,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      }
      if ((iVar2 == *(int *)((long)(layer->inputtensor_).super_RepeatedPtrFieldBase.rep_[1].elements
                                   [0] + 0x24)) &&
         (pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                             (&(layer->inputtensor_).super_RepeatedPtrFieldBase,1),
         pTVar8->rank_ == 1)) goto LAB_003198ce;
      psVar5 = (layer->name_).ptr_;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      pcVar4 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar4,pcVar4 + psVar5->_M_string_length);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x36957a);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_e0.field_2._M_allocated_capacity = *psVar10;
        local_e0.field_2._8_8_ = plVar9[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar10;
        local_e0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_e0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_120.field_2._M_allocated_capacity = *psVar10;
        local_120.field_2._8_8_ = plVar9[3];
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      }
      else {
        local_120.field_2._M_allocated_capacity = *psVar10;
        local_120._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_120._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
LAB_00319b45:
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
LAB_00319b52:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
    }
    else {
      local_a0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Scatter layer must have 3 input tensor fields filled","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
      _Var11._M_p = (pointer)local_a0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_a0 + 0x10)) {
LAB_00319a92:
        operator_delete(_Var11._M_p,local_a0._16_8_ + 1);
      }
    }
LAB_00319b7b:
    bVar6 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if (!bVar6) {
    return __return_storage_ptr__;
  }
LAB_00319b99:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScatterLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 3, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        std::string err;
        if (layer.inputtensor_size() > 0) {
            if (layer.inputtensor_size() != 3) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 3 input tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.inputtensor(2).rank() &&
                  layer.inputtensor(1).rank() == 1)) {
                err = "Input ranks of Scatter layer '" + std::string(layer.name()) + "' are invalid.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            if (layer.outputtensor_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 1 output tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.outputtensor(0).rank())) {
                err = "Output rank of Scatter layer '" + std::string(layer.name()) + "' does not match container input.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}